

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O0

ktx_error_code_e
ktxTexture_CreateFromMemory
          (ktx_uint8_t *bytes,ktx_size_t size,ktxTextureCreateFlags createFlags,ktxTexture **newTex)

{
  ktxTexture **in_RCX;
  ktxTextureCreateFlags in_EDX;
  ktxStream *in_RSI;
  long in_RDI;
  ktxStream stream;
  ktx_error_code_e result;
  ktx_size_t in_stack_ffffffffffffff78;
  ktx_uint8_t *in_stack_ffffffffffffff80;
  ktxStream *in_stack_ffffffffffffff88;
  undefined4 local_2c;
  undefined4 local_4;
  
  if (((in_RDI == 0) || (in_RCX == (ktxTexture **)0x0)) || (in_RSI == (ktxStream *)0x0)) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    local_2c = ktxMemStream_construct_ro
                         (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                          in_stack_ffffffffffffff78);
    if (local_2c == KTX_SUCCESS) {
      local_2c = ktxTexture_CreateFromStream(in_RSI,in_EDX,in_RCX);
    }
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxTexture_CreateFromMemory(const ktx_uint8_t* bytes, ktx_size_t size,
                            ktxTextureCreateFlags createFlags,
                            ktxTexture** newTex)
{
    KTX_error_code result;
    ktxStream stream;

    if (bytes == NULL || newTex == NULL || size == 0)
        return KTX_INVALID_VALUE;

    result = ktxMemStream_construct_ro(&stream, bytes, size);
    if (result == KTX_SUCCESS) {
        result = ktxTexture_CreateFromStream(&stream, createFlags, newTex);
    }
    return result;}